

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCallback.cpp
# Opt level: O3

bool __thiscall HighsCallback::callbackActive(HighsCallback *this,int callback_type)

{
  bool bVar1;
  
  bVar1 = false;
  if (((uint)callback_type < 10) &&
     (bVar1 = false, (this->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    bVar1 = (*(this->active).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p >>
             ((ulong)(uint)callback_type & 0x3f) & 1) != 0;
  }
  return bVar1;
}

Assistant:

bool HighsCallback::callbackActive(const int callback_type) {
  // Check that callback function has been defined
  if (!this->user_callback) return false;
  // Check that callback_type is within range
  const bool callback_type_ok =
      callback_type >= kCallbackMin && callback_type <= kCallbackMax;
  assert(callback_type_ok);
  if (!callback_type_ok) return false;
  // Don't call callback if it is not active
  assert(this->active.size() > 0);
  if (!this->active[callback_type]) return false;
  return true;
}